

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.cpp
# Opt level: O0

void uv11::Handle::close::anon_class_1_0_00000001::__invoke(uv_handle_t *param_1)

{
  anon_class_1_0_00000001 local_11;
  uv_handle_t *local_10;
  uv_handle_t *param_0_local;
  
  local_10 = param_1;
  operator()(&local_11,param_1);
  return;
}

Assistant:

void Handle::close(CloseCb const& close_cb) {
    on_close = close_cb;

    closing = true;
    ::uv_close(&GetHandle(), [](uv_handle_t* handle){
        Handle* h = reinterpret_cast<Handle*>(handle->data);
        h->on_close(*h);
    });
}